

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_attention.h
# Opt level: O1

void __thiscall
shift_window_transformer::WindowAttention<float>::forward
          (WindowAttention<float> *this,Tensor<float> *input,Tensor<float> *output)

{
  uint uVar1;
  uint uVar2;
  pointer pfVar3;
  pointer piVar4;
  Tensor<float> *pTVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  pointer pfVar10;
  int iVar11;
  int iVar12;
  ulong uVar13;
  int iVar14;
  int iVar15;
  int j;
  int iVar16;
  float *pfVar17;
  pointer pfVar18;
  long lVar19;
  int iVar20;
  long lVar21;
  int j_1;
  ulong uVar22;
  float fVar23;
  Tensor<float> dots;
  Tensor<float> tmp2;
  Tensor<float> tmp;
  Tensor<float> v;
  Tensor<float> q;
  Tensor<float> tmp3;
  Tensor<float> k;
  Tensor<float> vTmp;
  Tensor<float> kTmp;
  Tensor<float> tmp4;
  Tensor<float> attn;
  Tensor<float> qTmp;
  long local_2c0;
  Tensor<float> local_2a8;
  long local_278;
  long local_270;
  ulong local_268;
  int local_25c;
  void *local_258;
  iterator iStack_250;
  float *local_248;
  vector<int,_std::allocator<int>_> vStack_240;
  void *local_228;
  undefined8 uStack_220;
  long local_218;
  void *pvStack_210;
  undefined8 local_208;
  long lStack_200;
  Tensor<float> local_1f8;
  Tensor<float> local_1c8;
  vector<float,_std::allocator<float>_> local_198;
  vector<int,_std::allocator<int>_> vStack_180;
  Tensor<float> local_168;
  Tensor<float> local_138;
  Tensor<float> local_108;
  Tensor<float> *local_d8;
  long local_d0;
  void *local_c8;
  undefined8 uStack_c0;
  long local_b8;
  void *pvStack_b0;
  undefined8 local_a8;
  long lStack_a0;
  Tensor<float> local_98;
  Tensor<float> local_68;
  
  local_208 = 0;
  lStack_200 = 0;
  local_218 = 0;
  pvStack_210 = (void *)0x0;
  local_228 = (void *)0x0;
  uStack_220 = 0;
  if (this->shifted == true) {
    (*(code *)**(undefined8 **)this->cyclicShift)(this->cyclicShift,input,&local_228);
  }
  else {
    std::vector<float,std::allocator<float>>::
    _M_range_insert<__gnu_cxx::__normal_iterator<float_const*,std::vector<float,std::allocator<float>>>>
              ((vector<float,std::allocator<float>> *)&local_228,0,
               (input->super_vector<float,_std::allocator<float>_>).
               super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
               _M_start,(input->super_vector<float,_std::allocator<float>_>).
                        super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_finish);
    std::vector<int,std::allocator<int>>::
    _M_range_insert<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
              ((vector<int,std::allocator<int>> *)&pvStack_210,local_208,
               (input->shape).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start,
               (input->shape).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish);
  }
  local_68.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_68.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_68.super_vector<float,_std::allocator<float>_>.
  super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_68.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (int *)0x0;
  local_68.super_vector<float,_std::allocator<float>_>.
  super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_68.super_vector<float,_std::allocator<float>_>.
  super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_108.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_108.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_108.super_vector<float,_std::allocator<float>_>.
  super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_108.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_108.super_vector<float,_std::allocator<float>_>.
  super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_108.super_vector<float,_std::allocator<float>_>.
  super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_138.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_138.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_138.super_vector<float,_std::allocator<float>_>.
  super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_138.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_138.super_vector<float,_std::allocator<float>_>.
  super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_138.super_vector<float,_std::allocator<float>_>.
  super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  (**(this->qLinear->super_Layer<float>)._vptr_Layer)(this->qLinear,&local_228);
  (**(this->kLinear->super_Layer<float>)._vptr_Layer)(this->kLinear,&local_228,&local_108);
  (**(this->kLinear->super_Layer<float>)._vptr_Layer)(this->kLinear,&local_228,&local_138);
  local_1c8.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_1c8.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_1c8.super_vector<float,_std::allocator<float>_>.
  super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_1c8.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_1c8.super_vector<float,_std::allocator<float>_>.
  super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_1c8.super_vector<float,_std::allocator<float>_>.
  super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_168.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_168.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_168.super_vector<float,_std::allocator<float>_>.
  super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_168.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_168.super_vector<float,_std::allocator<float>_>.
  super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_168.super_vector<float,_std::allocator<float>_>.
  super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_1f8.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_1f8.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_1f8.super_vector<float,_std::allocator<float>_>.
  super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_1f8.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_1f8.super_vector<float,_std::allocator<float>_>.
  super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_1f8.super_vector<float,_std::allocator<float>_>.
  super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  iVar12 = this->windowSize;
  iVar20 = *local_68.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  iVar14 = local_68.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start[1] / iVar12;
  reArrange(this,&local_68,&local_1c8);
  reArrange(this,&local_108,&local_168);
  reArrange(this,&local_138,&local_1f8);
  local_2a8.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_2a8.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_2a8.super_vector<float,_std::allocator<float>_>.
  super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (float *)0x0;
  local_2a8.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (int *)0x0;
  local_2a8.super_vector<float,_std::allocator<float>_>.
  super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start =
       (float *)0x0;
  local_2a8.super_vector<float,_std::allocator<float>_>.
  super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_finish =
       (float *)0x0;
  uVar1 = local_1c8.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish[-2];
  uVar2 = local_1c8.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish[-1];
  local_25c = iVar20 / iVar12;
  local_d8 = output;
  std::vector<int,_std::allocator<int>_>::operator=(&local_2a8.shape,&local_1c8.shape);
  uVar8 = (ulong)uVar1;
  local_2a8.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish[-1] =
       local_2a8.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
       ._M_finish[-2];
  local_278 = (long)(int)uVar1;
  if (local_1c8.super_vector<float,_std::allocator<float>_>.
      super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_finish !=
      local_1c8.super_vector<float,_std::allocator<float>_>.
      super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start) {
    local_270 = (long)(int)(uVar2 * uVar1);
    local_d0 = local_270 * 4;
    local_2c0 = 0;
    uVar7 = 0;
    do {
      local_268 = uVar7;
      if (0 < (int)uVar1) {
        uVar7 = 0;
        lVar19 = local_2c0;
        do {
          uVar13 = 0;
          lVar21 = local_2c0;
          do {
            local_98.super_vector<float,_std::allocator<float>_>.
            super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
            _M_start = (pointer)((ulong)local_98.super_vector<float,_std::allocator<float>_>.
                                        super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                        super__Vector_impl_data._M_start & 0xffffffff00000000);
            pfVar3 = local_98.super_vector<float,_std::allocator<float>_>.
                     super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start;
            if (0 < (int)uVar2) {
              local_98.super_vector<float,_std::allocator<float>_>.
              super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
              _M_start._0_4_ = 0.0;
              uVar9 = 0;
              fVar23 = local_98.super_vector<float,_std::allocator<float>_>.
                       super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start._0_4_;
              local_98.super_vector<float,_std::allocator<float>_>.
              super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
              _M_start = pfVar3;
              do {
                fVar23 = fVar23 + *(float *)((long)local_1c8.
                                                   super_vector<float,_std::allocator<float>_>.
                                                   super__Vector_base<float,_std::allocator<float>_>
                                                   ._M_impl.super__Vector_impl_data._M_start +
                                            uVar9 * 4 + lVar19) *
                                  *(float *)((long)local_168.
                                                   super_vector<float,_std::allocator<float>_>.
                                                   super__Vector_base<float,_std::allocator<float>_>
                                                   ._M_impl.super__Vector_impl_data._M_start +
                                            uVar9 * 4 + lVar21);
                local_98.super_vector<float,_std::allocator<float>_>.
                super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
                _M_start = (pointer)CONCAT44(local_98.super_vector<float,_std::allocator<float>_>.
                                             super__Vector_base<float,_std::allocator<float>_>.
                                             _M_impl.super__Vector_impl_data._M_start._4_4_,fVar23);
                uVar9 = uVar9 + 1;
              } while (uVar2 != uVar9);
            }
            if (local_2a8.super_vector<float,_std::allocator<float>_>.
                super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
                _M_finish ==
                local_2a8.super_vector<float,_std::allocator<float>_>.
                super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
                _M_end_of_storage) {
              std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                        ((vector<float,std::allocator<float>> *)&local_2a8,
                         (iterator)
                         local_2a8.super_vector<float,_std::allocator<float>_>.
                         super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_finish,(float *)&local_98);
            }
            else {
              *local_2a8.super_vector<float,_std::allocator<float>_>.
               super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
               _M_finish = local_98.super_vector<float,_std::allocator<float>_>.
                           super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_start._0_4_;
              local_2a8.super_vector<float,_std::allocator<float>_>.
              super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
              _M_finish = local_2a8.super_vector<float,_std::allocator<float>_>.
                          super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_finish + 1;
            }
            uVar13 = uVar13 + 1;
            lVar21 = lVar21 + (long)(int)uVar2 * 4;
          } while (uVar13 != uVar8);
          uVar7 = uVar7 + 1;
          lVar19 = lVar19 + (long)(int)uVar2 * 4;
        } while (uVar7 != uVar8);
      }
      uVar7 = local_268 + local_270;
      local_2c0 = local_2c0 + local_d0;
    } while (uVar7 < (ulong)((long)local_1c8.super_vector<float,_std::allocator<float>_>.
                                   super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                   super__Vector_impl_data._M_finish -
                             (long)local_1c8.super_vector<float,_std::allocator<float>_>.
                                   super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                   super__Vector_impl_data._M_start >> 2));
  }
  pfVar3 = (this->posEmbedding->super_vector<float,_std::allocator<float>_>).
           super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
           _M_start;
  uVar7 = (long)(this->posEmbedding->super_vector<float,_std::allocator<float>_>).
                super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
                _M_finish - (long)pfVar3 >> 2;
  if (this->relativePosEmbedding == false) {
    uVar13 = (ulong)(uVar1 * uVar1);
    if (uVar7 != uVar13) {
      __assert_fail("posEmbedding->size() == matX * matX",
                    "/workspace/llm4binary/github/license_c_cmakelists/dianhsu[P]swin-transformer-cpp/model/window_attention.h"
                    ,0x8b,
                    "virtual void shift_window_transformer::WindowAttention<float>::forward(const Tensor<T> &, Tensor<T> &) [T = float]"
                   );
    }
    if ((long)local_2a8.super_vector<float,_std::allocator<float>_>.
              super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
              _M_finish -
        (long)local_2a8.super_vector<float,_std::allocator<float>_>.
              super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
              _M_start != 0) {
      uVar7 = 0;
      pfVar10 = local_2a8.super_vector<float,_std::allocator<float>_>.
                super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
                _M_start;
      do {
        if (0 < (int)uVar1) {
          uVar9 = 0;
          pfVar17 = pfVar10;
          pfVar18 = pfVar3;
          do {
            uVar22 = 0;
            do {
              pfVar17[uVar22] = pfVar18[uVar22] + pfVar17[uVar22];
              uVar22 = uVar22 + 1;
            } while (uVar8 != uVar22);
            uVar9 = uVar9 + 1;
            pfVar18 = pfVar18 + uVar8;
            pfVar17 = pfVar17 + uVar8;
          } while (uVar9 != uVar8);
        }
        uVar7 = uVar7 + uVar13;
        pfVar10 = pfVar10 + uVar13;
      } while (uVar7 < (ulong)((long)local_2a8.super_vector<float,_std::allocator<float>_>.
                                     super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                     super__Vector_impl_data._M_finish -
                               (long)local_2a8.super_vector<float,_std::allocator<float>_>.
                                     super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                     super__Vector_impl_data._M_start >> 2));
    }
  }
  else {
    lVar19 = (long)this->windowSize * 2 + -1;
    iVar12 = (int)lVar19;
    if (uVar7 != (uint)(iVar12 * iVar12)) {
      __assert_fail("posEmbedding->size() == (2 * windowSize - 1) * (2 * windowSize - 1)",
                    "/workspace/llm4binary/github/license_c_cmakelists/dianhsu[P]swin-transformer-cpp/model/window_attention.h"
                    ,0x80,
                    "virtual void shift_window_transformer::WindowAttention<float>::forward(const Tensor<T> &, Tensor<T> &) [T = float]"
                   );
    }
    if ((long)local_2a8.super_vector<float,_std::allocator<float>_>.
              super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
              _M_finish -
        (long)local_2a8.super_vector<float,_std::allocator<float>_>.
              super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
              _M_start != 0) {
      uVar7 = 0;
      pfVar10 = local_2a8.super_vector<float,_std::allocator<float>_>.
                super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
                _M_start;
      do {
        if (0 < (int)local_278) {
          piVar4 = (this->relativeIndices->super_vector<int,_std::allocator<int>_>).
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_start;
          iVar12 = 1;
          uVar13 = 0;
          pfVar17 = pfVar10;
          do {
            uVar9 = 0;
            iVar20 = iVar12;
            do {
              pfVar17[uVar9] =
                   pfVar3[(long)piVar4[iVar20] + piVar4[iVar20 + -1] * lVar19] + pfVar17[uVar9];
              uVar9 = uVar9 + 1;
              iVar20 = iVar20 + 2;
            } while (uVar8 != uVar9);
            uVar13 = uVar13 + 1;
            pfVar17 = pfVar17 + local_278;
            iVar12 = iVar12 + uVar1 * 2;
          } while (uVar13 != uVar8);
        }
        uVar7 = uVar7 + (long)(int)(uVar1 * uVar1);
        pfVar10 = pfVar10 + (int)(uVar1 * uVar1);
      } while (uVar7 < (ulong)((long)local_2a8.super_vector<float,_std::allocator<float>_>.
                                     super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                     super__Vector_impl_data._M_finish -
                               (long)local_2a8.super_vector<float,_std::allocator<float>_>.
                                     super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                     super__Vector_impl_data._M_start >> 2));
    }
  }
  if (this->shifted == true) {
    uVar8 = (long)local_2a8.super_vector<float,_std::allocator<float>_>.
                  super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
                  _M_finish -
            (long)local_2a8.super_vector<float,_std::allocator<float>_>.
                  super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
                  _M_start >> 2;
    iVar12 = *local_2a8.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (local_2a8.super_vector<float,_std::allocator<float>_>.
        super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_finish
        != local_2a8.super_vector<float,_std::allocator<float>_>.
           super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
           _M_start) {
      iVar20 = local_2a8.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[1];
      local_268 = CONCAT44(local_268._4_4_,iVar20 - iVar14);
      local_270 = CONCAT44(local_270._4_4_,iVar14 + -1);
      uVar7 = 0;
      do {
        if (0 < iVar14) {
          uVar1 = local_2a8.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[2];
          iVar11 = iVar20 - iVar14;
          do {
            if (0 < (int)uVar1) {
              uVar2 = local_2a8.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[3];
              pTVar5 = this->upperLowerMask;
              lVar19 = 0;
              uVar13 = 0;
              do {
                if (0 < (int)uVar2) {
                  pfVar3 = (pTVar5->super_vector<float,_std::allocator<float>_>).
                           super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_start;
                  uVar9 = 0;
                  do {
                    iVar15 = (int)uVar9 + (int)uVar7 + uVar1 * iVar11 * uVar2 + (int)uVar13 * uVar2;
                    local_2a8.super_vector<float,_std::allocator<float>_>.
                    super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start[iVar15] =
                         *(float *)((long)pfVar3 + uVar9 * 4 + lVar19) +
                         local_2a8.super_vector<float,_std::allocator<float>_>.
                         super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_start[iVar15];
                    uVar9 = uVar9 + 1;
                  } while (uVar2 != uVar9);
                }
                uVar13 = uVar13 + 1;
                lVar19 = lVar19 + (long)(int)uVar2 * 4;
              } while (uVar13 != uVar1);
            }
            iVar11 = iVar11 + 1;
          } while (iVar11 < iVar20);
        }
        if (iVar14 <= iVar20) {
          uVar1 = local_2a8.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[2];
          iVar11 = iVar14 + -1;
          do {
            if (0 < (int)uVar1) {
              uVar2 = local_2a8.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[3];
              pTVar5 = this->leftRightMask;
              lVar19 = 0;
              uVar13 = 0;
              do {
                if (0 < (int)uVar2) {
                  pfVar3 = (pTVar5->super_vector<float,_std::allocator<float>_>).
                           super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_start;
                  uVar9 = 0;
                  do {
                    iVar15 = (int)uVar9 + (int)uVar7 + uVar1 * iVar11 * uVar2 + (int)uVar13 * uVar2;
                    local_2a8.super_vector<float,_std::allocator<float>_>.
                    super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start[iVar15] =
                         *(float *)((long)pfVar3 + uVar9 * 4 + lVar19) +
                         local_2a8.super_vector<float,_std::allocator<float>_>.
                         super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_start[iVar15];
                    uVar9 = uVar9 + 1;
                  } while (uVar2 != uVar9);
                }
                uVar13 = uVar13 + 1;
                lVar19 = lVar19 + (long)(int)uVar2 * 4;
              } while (uVar13 != uVar1);
            }
            iVar11 = iVar11 + iVar14;
          } while (iVar11 < iVar20);
        }
        uVar7 = uVar7 + (long)(int)(uVar8 / (ulong)(long)iVar12);
      } while (uVar7 < uVar8);
    }
  }
  local_98.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_98.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_98.super_vector<float,_std::allocator<float>_>.
  super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_98.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_98.super_vector<float,_std::allocator<float>_>.
  super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_98.super_vector<float,_std::allocator<float>_>.
  super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  SoftMax<float>::forward(&this->softMax,&local_2a8,&local_98);
  vStack_240.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  vStack_240.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_248 = (float *)0x0;
  vStack_240.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_258 = (void *)0x0;
  iStack_250._M_current = (float *)0x0;
  std::vector<int,_std::allocator<int>_>::operator=(&vStack_240,&local_1f8.shape);
  if (0 < local_2a8.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[1] *
          *local_2a8.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start) {
    iVar12 = 0;
    do {
      if (0 < local_2a8.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[2]) {
        iVar20 = 0;
        do {
          if (0 < local_1f8.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[3]) {
            iVar11 = 0;
            do {
              local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start =
                   (pointer)((ulong)local_198.super__Vector_base<float,_std::allocator<float>_>.
                                    _M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
              pfVar3 = local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start;
              iVar15 = local_2a8.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[3];
              if (0 < (long)iVar15) {
                local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start._0_4_ = 0.0;
                iVar16 = iVar12 * local_1f8.shape.super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data._M_start[3] *
                         local_1f8.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[2] + iVar11;
                lVar19 = 0;
                fVar23 = local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_start._0_4_;
                local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start = pfVar3;
                do {
                  fVar23 = fVar23 + local_2a8.super_vector<float,_std::allocator<float>_>.
                                    super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                    super__Vector_impl_data._M_start
                                    [(local_2a8.shape.super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Vector_impl_data._M_start[2] * iVar12 + iVar20)
                                     * iVar15 + lVar19] *
                                    local_1f8.super_vector<float,_std::allocator<float>_>.
                                    super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                    super__Vector_impl_data._M_start[iVar16];
                  local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_start =
                       (pointer)CONCAT44(local_198.super__Vector_base<float,_std::allocator<float>_>
                                         ._M_impl.super__Vector_impl_data._M_start._4_4_,fVar23);
                  lVar19 = lVar19 + 1;
                  iVar16 = iVar16 + local_1f8.shape.super__Vector_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Vector_impl_data._M_start[3];
                } while (iVar15 != lVar19);
              }
              if (iStack_250._M_current == local_248) {
                std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                          ((vector<float,std::allocator<float>> *)&local_258,iStack_250,
                           (float *)&local_198);
              }
              else {
                *iStack_250._M_current =
                     local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start._0_4_;
                iStack_250._M_current = iStack_250._M_current + 1;
              }
              iVar11 = iVar11 + 1;
            } while (iVar11 < local_1f8.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start[3]);
          }
          iVar20 = iVar20 + 1;
        } while (iVar20 < local_2a8.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[2]);
      }
      iVar12 = iVar12 + 1;
    } while (iVar12 < local_2a8.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[1] *
                      *local_2a8.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start);
  }
  vStack_180.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  vStack_180.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  vStack_180.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  std::vector<float,_std::allocator<float>_>::resize
            (&local_198,(long)iStack_250._M_current - (long)local_258 >> 2);
  std::vector<int,_std::allocator<int>_>::operator=(&vStack_180,&local_68.shape);
  if ((long)iStack_250._M_current - (long)local_258 != 0) {
    lVar19 = (long)iStack_250._M_current - (long)local_258 >> 2;
    iVar12 = this->windowSize;
    iVar20 = this->headDim;
    iVar11 = this->heads;
    uVar8 = 0;
    do {
      uVar7 = (ulong)(uint)((int)uVar8 >> 0x1f) << 0x20 | uVar8 & 0xffffffff;
      uVar13 = (long)uVar7 / (long)iVar20;
      uVar13 = (ulong)(uint)((int)uVar13 >> 0x1f) << 0x20 | uVar13 & 0xffffffff;
      uVar9 = (long)uVar13 / (long)iVar12;
      uVar9 = (ulong)(uint)((int)uVar9 >> 0x1f) << 0x20 | uVar9 & 0xffffffff;
      uVar22 = (long)uVar9 / (long)iVar12;
      uVar22 = (ulong)(uint)((int)uVar22 >> 0x1f) << 0x20 | uVar22 & 0xffffffff;
      uVar6 = (long)uVar22 / (long)iVar14;
      uVar6 = (ulong)(uint)((int)uVar6 >> 0x1f) << 0x20 | uVar6 & 0xffffffff;
      local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start[(((int)((long)uVar9 % (long)iVar12) * iVar12 + (int)((long)uVar13 % (long)iVar12) +
                 (int)((long)uVar22 % (long)iVar14) * iVar12 * iVar12 +
                (int)((long)uVar6 % (long)local_25c) * iVar14 * iVar12 * iVar12) * iVar11 +
               (int)((long)uVar6 / (long)local_25c)) * iVar20 + (int)((long)uVar7 % (long)iVar20)] =
           *(float *)((long)local_258 + uVar8 * 4);
      uVar8 = uVar8 + 1;
    } while (lVar19 + (ulong)(lVar19 == 0) != uVar8);
  }
  local_a8 = 0;
  lStack_a0 = 0;
  local_b8 = 0;
  pvStack_b0 = (void *)0x0;
  local_c8 = (void *)0x0;
  uStack_c0 = 0;
  (**(this->outLinear->super_Layer<float>)._vptr_Layer)(this->outLinear,&local_198);
  pTVar5 = local_d8;
  if (this->shifted == true) {
    (*(code *)**(undefined8 **)this->cyclicBackShift)(this->cyclicBackShift,&local_c8,local_d8);
  }
  else {
    pfVar3 = (local_d8->super_vector<float,_std::allocator<float>_>).
             super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
             _M_start;
    if ((local_d8->super_vector<float,_std::allocator<float>_>).
        super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_finish
        != pfVar3) {
      (local_d8->super_vector<float,_std::allocator<float>_>).
      super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_finish =
           pfVar3;
    }
    piVar4 = (local_d8->shape).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((local_d8->shape).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish != piVar4) {
      (local_d8->shape).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = piVar4;
    }
    std::vector<float,std::allocator<float>>::
    _M_range_insert<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>>
              ((vector<float,std::allocator<float>> *)local_d8,
               (local_d8->super_vector<float,_std::allocator<float>_>).
               super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
               _M_finish,local_c8,uStack_c0);
    std::vector<int,std::allocator<int>>::
    _M_range_insert<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
              ((vector<int,std::allocator<int>> *)&pTVar5->shape,
               (pTVar5->shape).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,pvStack_b0,local_a8);
  }
  if (pvStack_b0 != (void *)0x0) {
    operator_delete(pvStack_b0,lStack_a0 - (long)pvStack_b0);
  }
  if (local_c8 != (void *)0x0) {
    operator_delete(local_c8,local_b8 - (long)local_c8);
  }
  if (vStack_180.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(vStack_180.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)vStack_180.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)vStack_180.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (vStack_240.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(vStack_240.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)vStack_240.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)vStack_240.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_258 != (void *)0x0) {
    operator_delete(local_258,(long)local_248 - (long)local_258);
  }
  if (local_98.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_98.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_98.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_98.super_vector<float,_std::allocator<float>_>.
      super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start !=
      (pointer)0x0) {
    operator_delete(local_98.super_vector<float,_std::allocator<float>_>.
                    super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_98.super_vector<float,_std::allocator<float>_>.
                          super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.super_vector<float,_std::allocator<float>_>.
                          super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_2a8.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_2a8.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_2a8.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_2a8.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_2a8.super_vector<float,_std::allocator<float>_>.
      super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start !=
      (float *)0x0) {
    operator_delete(local_2a8.super_vector<float,_std::allocator<float>_>.
                    super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_2a8.super_vector<float,_std::allocator<float>_>.
                          super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_2a8.super_vector<float,_std::allocator<float>_>.
                          super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_1f8.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_1f8.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1f8.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1f8.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_1f8.super_vector<float,_std::allocator<float>_>.
      super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start !=
      (pointer)0x0) {
    operator_delete(local_1f8.super_vector<float,_std::allocator<float>_>.
                    super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1f8.super_vector<float,_std::allocator<float>_>.
                          super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1f8.super_vector<float,_std::allocator<float>_>.
                          super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_168.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_168.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_168.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_168.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_168.super_vector<float,_std::allocator<float>_>.
      super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start !=
      (pointer)0x0) {
    operator_delete(local_168.super_vector<float,_std::allocator<float>_>.
                    super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_168.super_vector<float,_std::allocator<float>_>.
                          super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_168.super_vector<float,_std::allocator<float>_>.
                          super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_1c8.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_1c8.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1c8.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1c8.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_1c8.super_vector<float,_std::allocator<float>_>.
      super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start !=
      (pointer)0x0) {
    operator_delete(local_1c8.super_vector<float,_std::allocator<float>_>.
                    super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1c8.super_vector<float,_std::allocator<float>_>.
                          super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1c8.super_vector<float,_std::allocator<float>_>.
                          super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_138.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_138.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_138.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_138.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_138.super_vector<float,_std::allocator<float>_>.
      super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start !=
      (pointer)0x0) {
    operator_delete(local_138.super_vector<float,_std::allocator<float>_>.
                    super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_138.super_vector<float,_std::allocator<float>_>.
                          super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_138.super_vector<float,_std::allocator<float>_>.
                          super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_108.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_108.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_108.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_108.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_108.super_vector<float,_std::allocator<float>_>.
      super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start !=
      (pointer)0x0) {
    operator_delete(local_108.super_vector<float,_std::allocator<float>_>.
                    super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_108.super_vector<float,_std::allocator<float>_>.
                          super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_108.super_vector<float,_std::allocator<float>_>.
                          super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_68.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_68.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_68.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_68.super_vector<float,_std::allocator<float>_>.
      super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start !=
      (pointer)0x0) {
    operator_delete(local_68.super_vector<float,_std::allocator<float>_>.
                    super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_68.super_vector<float,_std::allocator<float>_>.
                          super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.super_vector<float,_std::allocator<float>_>.
                          super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (pvStack_210 != (void *)0x0) {
    operator_delete(pvStack_210,lStack_200 - (long)pvStack_210);
  }
  if (local_228 != (void *)0x0) {
    operator_delete(local_228,local_218 - (long)local_228);
  }
  return;
}

Assistant:

void forward(const Tensor<T> &input, Tensor<T> &output) {
            Tensor<T> tmp{};
            if (shifted) {
                cyclicShift->forward(input, tmp);
            } else {
                tmp.insert(tmp.end(), input.begin(), input.end());
                tmp.shape.insert(tmp.shape.end(), input.shape.begin(), input.shape.end());
            }
            Tensor<T> qTmp{};
            Tensor<T> kTmp{};
            Tensor<T> vTmp{};
            qLinear->forward(tmp, qTmp);
            kLinear->forward(tmp, kTmp);
            kLinear->forward(tmp, vTmp);
            Tensor<T> q{}, k{}, v{};
            int nw_h = qTmp.shape[0] / windowSize, nw_w = qTmp.shape[1] / windowSize;
            reArrange(qTmp, q);
            reArrange(kTmp, k);
            reArrange(vTmp, v);
            Tensor<T> dots{};
            int matX = q.shape[q.shape.size() - 2];
            int matY = q.shape[q.shape.size() - 1];
            dots.shape = q.shape;
            dots.shape[dots.shape.size() - 1] = dots.shape[dots.shape.size() - 2];
            for (int pos = 0; pos < q.size(); pos += matX * matY) {
                for (int pi = 0; pi < matX; ++pi) {
                    for (int pj = 0; pj < matX; ++pj) {
                        T val = 0;
                        for (int pk = 0; pk < matY; ++pk) {
                            val += q[pos + pi * matY + pk] * k[pos + pj * matY + pk];
                        }
                        dots.push_back(val);
                    }
                }
            }

            if (relativePosEmbedding) {
                assert(posEmbedding->size() == (2 * windowSize - 1) * (2 * windowSize - 1));
                for (int pos = 0; pos < dots.size(); pos += matX * matX) {
                    for (int i = 0; i < matX; ++i) {
                        for (int j = 0; j < matX; ++j) {
                            dots[pos + i * matX + j] += (*posEmbedding)[
                                    (*relativeIndices)[i * matX * 2 + j * 2] * (2 * windowSize - 1) +
                                    (*relativeIndices)[i * matX * 2 + j * 2 + 1]];
                        }
                    }
                }
            } else {
                assert(posEmbedding->size() == matX * matX);
                for (int pos = 0; pos < dots.size(); pos += matX * matX) {
                    for (int i = 0; i < matX; ++i) {
                        for (int j = 0; j < matX; ++j) {
                            dots[pos + i * matX + j] += (*posEmbedding)[i * matX + j];
                        }
                    }
                }
            }

            if (shifted) {
                int batch = dots.size() / dots.shape[0];
                for (int pos = 0; pos < dots.size(); pos += batch) {
                    for (int pi = dots.shape[1] - nw_w; pi < dots.shape[1]; ++pi) {
                        for (int pj = 0; pj < dots.shape[2]; ++pj) {
                            for (int pk = 0; pk < dots.shape[3]; ++pk) {
                                dots[pos + pi * dots.shape[2] * dots.shape[3] + pj * dots.shape[3] +
                                     pk] += (*upperLowerMask)[pj * dots.shape[3] + pk];
                            }
                        }
                    }
                    for (int pi = nw_w - 1; pi < dots.shape[1]; pi += nw_w) {
                        for (int pj = 0; pj < dots.shape[2]; ++pj) {
                            for (int pk = 0; pk < dots.shape[3]; ++pk) {
                                dots[pos + pi * dots.shape[2] * dots.shape[3] + pj * dots.shape[3] +
                                     pk] += (*leftRightMask)[pj * dots.shape[3] + pk];
                            }
                        }
                    }
                }
            }
            Tensor<T> attn{};
            softMax.forward(dots, attn);
            Tensor<T> tmp2{};
            tmp2.shape = v.shape;
            for (int pos = 0; pos < dots.shape[0] * dots.shape[1]; ++pos) {
                for (int pi = 0; pi < dots.shape[2]; ++pi) {
                    for (int pj = 0; pj < v.shape[3]; ++pj) {
                        T val = 0;
                        for (int pk = 0; pk < dots.shape[3]; ++pk) {
                            val += dots[pos * dots.shape[2] * dots.shape[3] + pi * dots.shape[3] + pk] *
                                   v[pos * v.shape[2] * v.shape[3] + pk * v.shape[3] + pj];
                        }
                        tmp2.push_back(val);
                    }
                }
            }
            Tensor<T> tmp3{};
            tmp3.resize(tmp2.size());
            tmp3.shape = qTmp.shape;
            for (int i = 0; i < tmp2.size(); ++i) {
                int d = i % headDim;
                int w_w = i / headDim % windowSize;
                int w_h = i / headDim / windowSize % windowSize;
                int mw_w = i / headDim / windowSize / windowSize % nw_w;
                int mw_h = i / headDim / windowSize / windowSize / nw_w % nw_h;
                int h = i / headDim / windowSize / windowSize / nw_w / nw_h;
                int new_pos = d + h * headDim +
                              w_w * headDim * heads +
                              w_h * windowSize * headDim * heads +
                              mw_w * windowSize * windowSize * headDim * heads +
                              mw_h * nw_w * windowSize * windowSize * headDim * heads;
                tmp3[new_pos] = tmp2[i];
            }
            Tensor<T> tmp4{};
            outLinear->forward(tmp3, tmp4);

            if (shifted) {
                cyclicBackShift->forward(tmp4, output);
            } else {
                output.clear();
                output.shape.clear();
                output.insert(output.end(), tmp4.begin(), tmp4.end());
                output.shape.insert(output.shape.end(), tmp4.shape.begin(), tmp4.shape.end());
            }
        }